

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

bool any_arg_contains(QList<FunctionDef> *functions,QByteArray *pattern)

{
  QByteArrayView bv;
  bool bVar1;
  FunctionDef *pFVar2;
  const_iterator o;
  ArgumentDef *this;
  long in_FS_OFFSET;
  ArgumentDef *arg;
  QList<ArgumentDef> *__range2;
  FunctionDef *f;
  QList<FunctionDef> *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArray *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  QList<ArgumentDef> *pQVar3;
  bool local_49;
  const_iterator local_28;
  FunctionDef *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (FunctionDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<FunctionDef>::begin
                       ((QList<FunctionDef> *)
                        CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  local_18.i = (FunctionDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<FunctionDef>::end
                       ((QList<FunctionDef> *)
                        CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  do {
    local_20 = local_18.i;
    bVar1 = QList<FunctionDef>::const_iterator::operator!=(&local_10,local_18);
    if (!bVar1) {
      local_49 = false;
LAB_0015f97e:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_49;
      }
      __stack_chk_fail();
    }
    pFVar2 = QList<FunctionDef>::const_iterator::operator*(&local_10);
    pQVar3 = &pFVar2->arguments;
    local_28.i = (ArgumentDef *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<ArgumentDef>::begin
                         ((QList<ArgumentDef> *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    o = QList<ArgumentDef>::end
                  ((QList<ArgumentDef> *)
                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    while( true ) {
      bVar1 = QList<ArgumentDef>::const_iterator::operator!=(&local_28,o);
      if (!bVar1) break;
      this = QList<ArgumentDef>::const_iterator::operator*(&local_28);
      QByteArrayView::QByteArrayView<QByteArray,_true>((QByteArrayView *)this,&this->normalizedType)
      ;
      bv.m_data = (storage_type *)pQVar3;
      bv.m_size = (qsizetype)this;
      bVar1 = QByteArray::contains(in_stack_ffffffffffffff68,bv);
      if (bVar1) {
        local_49 = true;
        goto LAB_0015f97e;
      }
      QList<ArgumentDef>::const_iterator::operator++(&local_28);
    }
    QList<FunctionDef>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

static bool any_arg_contains(const QList<FunctionDef> &functions, const QByteArray &pattern)
{
    for (const auto &f : functions) {
        for (const auto &arg : f.arguments) {
            if (arg.normalizedType.contains(pattern))
                return true;
        }
    }
    return false;
}